

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O2

void __thiscall testing::InSequence::~InSequence(InSequence *this)

{
  Sequence *pSVar1;
  Sequence **ppSVar2;
  
  if (this->sequence_created_ == true) {
    ppSVar2 = internal::ThreadLocal<testing::Sequence_*>::GetOrCreateValue
                        ((ThreadLocal<testing::Sequence_*> *)internal::g_gmock_implicit_sequence);
    pSVar1 = *ppSVar2;
    if (pSVar1 != (Sequence *)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&(pSVar1->last_expectation_).
                  super___shared_ptr<testing::Expectation,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    operator_delete(pSVar1,0x10);
    ppSVar2 = internal::ThreadLocal<testing::Sequence_*>::GetOrCreateValue
                        ((ThreadLocal<testing::Sequence_*> *)internal::g_gmock_implicit_sequence);
    *ppSVar2 = (Sequence *)0x0;
  }
  return;
}

Assistant:

InSequence::~InSequence() {
  if (sequence_created_) {
    delete internal::g_gmock_implicit_sequence.get();
    internal::g_gmock_implicit_sequence.set(nullptr);
  }
}